

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DebugWriter.cpp
# Opt level: O2

void __thiscall UnifiedRegex::DebugWriter::PrintQuotedChar(DebugWriter *this,Char c)

{
  undefined6 in_register_00000032;
  
  CheckForNewline(this);
  Output::Print(L"\'");
  if ((int)CONCAT62(in_register_00000032,c) == 0x27) {
    Output::Print(L"\\\'");
  }
  else {
    PrintEscapedChar(this,c);
  }
  Output::Print(L"\'");
  return;
}

Assistant:

void DebugWriter::PrintQuotedChar(const Char c)
    {
        CheckForNewline();
        Output::Print(_u("'"));
        if (c == '\'')
            Output::Print(_u("\\'"));
        else
            PrintEscapedChar(c);
        Output::Print(_u("'"));
    }